

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O0

void __thiscall
CheckedSharedTimedMutexTest_TryLockUntilReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedTimedMutexTest_TryLockUntilReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  anon_class_1_0_00000001 local_11;
  CheckedSharedTimedMutexTest_TryLockUntilReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *pCStack_10;
  anon_class_1_0_00000001 test_body;
  CheckedSharedTimedMutexTest_TryLockUntilReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  pCStack_10 = this;
  TestBody::anon_class_1_0_00000001::operator()(&local_11);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedTimedMutexTest, TryLockUntilReaderDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx1;
    TypeParam mtx2;
    yamc::test::task_runner(2, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_TRUE(mtx1.try_lock_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT));
        step.await();  // p1
        EXPECT_NO_THROW(mtx2.lock_shared());
        EXPECT_NO_THROW(mtx2.unlock_shared());
        step.await();  // p2
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_NO_THROW(mtx2.try_lock_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT));
        step.await();  // p1
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock_shared();
        });
        EXPECT_NO_THROW(mtx2.unlock());
        step.await();  // p2
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}